

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsIntersectTwoEdges(FmsInt *edge1,FmsInt *edge2,FmsInt *v_common)

{
  int num_common;
  FmsInt *v_common_local;
  FmsInt *edge2_local;
  FmsInt *edge1_local;
  
  num_common = 0;
  if ((*edge1 == *edge2) || (*edge1 == edge2[1])) {
    *v_common = *edge1;
    num_common = 1;
  }
  if ((*edge1 != edge1[1]) && ((edge1[1] == *edge2 || (edge1[1] == edge2[1])))) {
    *v_common = edge1[1];
    num_common = num_common + 1;
  }
  return num_common;
}

Assistant:

static inline int FmsIntersectTwoEdges(FmsInt *edge1, FmsInt *edge2,
                                       FmsInt *v_common) {
  int num_common = 0;
  if (edge1[0] == edge2[0] || edge1[0] == edge2[1]) {
    *v_common = edge1[0];
    num_common++;
  }
  if (edge1[0] != edge1[1]) {
    if (edge1[1] == edge2[0] || edge1[1] == edge2[1]) {
      *v_common = edge1[1];
      num_common++;
    }
  }
  return num_common;
}